

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# teglThreadCleanUpTests.cpp
# Opt level: O2

void __thiscall
deqp::egl::anon_unknown_0::ThreadCleanUpTest::ThreadCleanUpTest
          (ThreadCleanUpTest *this,EglTestContext *eglTestCtx,ContextType contextType,
          SurfaceType surfaceType)

{
  char *local_40;
  undefined8 local_38;
  char local_30 [16];
  
  local_40 = local_30;
  local_38 = 0;
  local_30[0] = '\0';
  std::__cxx11::string::append((char *)&local_40);
  std::__cxx11::string::append((char *)&local_40);
  egl::TestCase::TestCase
            (&this->super_TestCase,eglTestCtx,local_40,"Simple thread context clean up test");
  std::__cxx11::string::~string((string *)&local_40);
  (this->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode =
       (_func_int **)&PTR__ThreadCleanUpTest_01e0b0b0;
  this->m_contextType = contextType;
  this->m_surfaceType = surfaceType;
  this->m_iterCount = 0xfa;
  this->m_iterNdx = 0;
  this->m_display = (EGLDisplay)0x0;
  this->m_config = (EGLConfig)0x0;
  this->m_surface = (EGLSurface)0x0;
  this->m_context = (EGLContext)0x0;
  return;
}

Assistant:

ThreadCleanUpTest (EglTestContext& eglTestCtx, ContextType contextType, SurfaceType surfaceType)
		: TestCase			(eglTestCtx, testCaseName(contextType, surfaceType).c_str(), "Simple thread context clean up test")
		, m_contextType		(contextType)
		, m_surfaceType		(surfaceType)
		, m_iterCount		(250)
		, m_iterNdx			(0)
		, m_display			(EGL_NO_DISPLAY)
		, m_config			(0)
		, m_surface			(EGL_NO_SURFACE)
		, m_context			(EGL_NO_CONTEXT)
	{
	}